

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::initStyleOption(QComboBox *this,QStyleOptionComboBox *option)

{
  byte *pbVar1;
  State *pSVar2;
  QModelIndex *index;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  undefined1 *puVar5;
  QAbstractItemModel *pQVar6;
  QIconPrivate *pQVar7;
  bool bVar8;
  char cVar9;
  Int IVar10;
  QSize QVar11;
  long in_FS_OFFSET;
  QIcon moved;
  QModelIndex local_78;
  QIconPrivate *local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (option != (QStyleOptionComboBox *)0x0) {
    index = *(QModelIndex **)&(this->super_QWidget).field_0x8;
    QStyleOption::initFrom((QStyleOption *)option,&this->super_QWidget);
    option->editable = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2a0) != 0;
    option->frame = (bool)((byte)index[0x23].c >> 2 & 1);
    bVar8 = QWidget::hasFocus(&this->super_QWidget);
    if ((bVar8) && (option->editable == false)) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOptionComplex).super_QStyleOption.state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    (option->super_QStyleOptionComplex).subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>
    .super_QFlagsStorage<QStyle::SubControl>.i = 0xffffffff;
    if (*(int *)&index[0x21].m.ptr == 4) {
      (option->super_QStyleOptionComplex).activeSubControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i = 4
      ;
      pSVar2 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      (pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
           super_QFlagsStorage<QStyle::StateFlag>.i | *(uint *)&index[0x21].m.ptr;
    }
    else {
      (option->super_QStyleOptionComplex).activeSubControls.
      super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
           *(Int *)((long)&index[0x21].m.ptr + 4);
    }
    currentText((QString *)&local_58,this);
    pQVar3 = &((option->currentText).d.d)->super_QArrayData;
    pcVar4 = (option->currentText).d.ptr;
    (option->currentText).d.d = (Data *)local_58.shared;
    (option->currentText).d.ptr = (char16_t *)local_58._8_8_;
    puVar5 = (undefined1 *)(option->currentText).d.size;
    (option->currentText).d.size = local_58._16_8_;
    local_58.shared = (PrivateShared *)pQVar3;
    local_58._8_8_ = pcVar4;
    local_58._16_8_ = puVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    cVar9 = QPersistentModelIndex::isValid();
    if (cVar9 != '\0') {
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_58,(QPersistentModelIndex *)(index + 0x1d));
      QComboBoxPrivate::itemIcon((QComboBoxPrivate *)&local_60,index);
      pQVar7 = local_60;
      local_60 = (QIconPrivate *)0x0;
      local_78._0_8_ = (option->currentIcon).d;
      (option->currentIcon).d = pQVar7;
      QIcon::~QIcon((QIcon *)&local_78);
      QIcon::~QIcon((QIcon *)&local_60);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = index[0x1b].m.ptr;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_78,(QPersistentModelIndex *)(index + 0x1d));
      (**(code **)(*(long *)pQVar6 + 0x90))(&local_58,pQVar6,&local_78,7);
      if ((undefined1 *)0x3 < puStack_40) {
        IVar10 = ::QVariant::toUInt((bool *)local_58.data);
        (option->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i = IVar10;
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QVar11 = iconSize(this);
    option->iconSize = QVar11;
    if ((((index[0x1c].i != 0) && (*(int *)(index[0x1c].i + 4) != 0)) &&
        (index[0x1c].m.ptr != (QAbstractItemModel *)0x0)) &&
       ((*(byte *)(*(long *)(index[0x1c].m.ptr + 0x20) + 9) & 0x80) != 0)) {
      pSVar2 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
      *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 0x20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::initStyleOption(QStyleOptionComboBox *option) const
{
    if (!option)
        return;

    Q_D(const QComboBox);
    option->initFrom(this);
    option->editable = isEditable();
    option->frame = d->frame;
    if (hasFocus() && !option->editable)
        option->state |= QStyle::State_Selected;
    option->subControls = QStyle::SC_All;
    if (d->arrowState == QStyle::State_Sunken) {
        option->activeSubControls = QStyle::SC_ComboBoxArrow;
        option->state |= d->arrowState;
    } else {
        option->activeSubControls = d->hoverControl;
    }
    option->currentText = currentText();
    if (d->currentIndex.isValid()) {
        option->currentIcon = d->itemIcon(d->currentIndex);
        QVariant alignment = d->model->data(d->currentIndex, Qt::TextAlignmentRole);
        if (alignment.isValid())
            option->textAlignment = static_cast<Qt::Alignment>(alignment.toUInt());
    }
    option->iconSize = iconSize();
    if (d->container && d->container->isVisible())
        option->state |= QStyle::State_On;
}